

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  int extraout_EAX;
  reference ppVar2;
  Variable *pVVar3;
  Statement *pSVar4;
  Terminator *pTVar5;
  pool_ptr<soul::heart::Terminator> local_a0;
  Iterator local_98;
  Statement *local_90;
  Statement *local_88;
  Statement *s;
  Iterator local_78;
  Iterator __end2_1;
  Iterator __begin2_1;
  LinkedList<soul::heart::Statement> *__range2_1;
  pool_ref<soul::heart::Variable> local_50;
  pool_ref<soul::heart::Variable> local_48;
  pool_ref<soul::heart::Variable> p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range2;
  Iterator last;
  Block *old_local;
  Block *b_local;
  ModuleCloner *this_local;
  
  last.object = (Statement *)__child_stack;
  LinkedList<soul::heart::Statement>::Iterator::Iterator((Iterator *)&__range2);
  pSVar4 = last.object + 1;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
           ::begin((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                    *)pSVar4);
  p.object = (Variable *)
             std::
             vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ::end((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                    *)pSVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                                *)&p);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
             ::operator*(&__end2);
    local_48.object = ppVar2->object;
    pVVar3 = pool_ref::operator_cast_to_Variable_((pool_ref *)&local_48);
    pVVar3 = cloneVariable(this,pVVar3);
    pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>(&local_50,pVVar3);
    std::
    vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
    ::push_back((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 *)(__fn + 0x20),&local_50);
    pool_ref<soul::heart::Variable>::~pool_ref(&local_50);
    pool_ref<soul::heart::Variable>::~pool_ref(&local_48);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = LinkedList<soul::heart::Statement>::begin
                       ((LinkedList<soul::heart::Statement> *)&last.object[1].nextObject);
  local_78 = LinkedList<soul::heart::Statement>::end();
  while( true ) {
    s = local_78.object;
    bVar1 = LinkedList<soul::heart::Statement>::Iterator::operator!=(&__end2_1,local_78);
    if (!bVar1) break;
    local_88 = LinkedList<soul::heart::Statement>::Iterator::operator*(&__end2_1);
    local_98.object = (Statement *)__range2;
    pSVar4 = cloneStatement(this,local_88);
    local_90 = (Statement *)
               LinkedList<soul::heart::Statement>::insertAfter
                         ((LinkedList<soul::heart::Statement> *)(__fn + 0x38),local_98,pSVar4);
    __range2 = (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                *)local_90;
    LinkedList<soul::heart::Statement>::Iterator::operator++(&__end2_1);
  }
  bVar1 = heart::Block::isTerminated((Block *)last.object);
  checkAssertion(bVar1,"old.isTerminated()","clone",0x137);
  pTVar5 = pool_ptr<soul::heart::Terminator>::operator*
                     ((pool_ptr<soul::heart::Terminator> *)(last.object + 2));
  pTVar5 = cloneTerminator(this,pTVar5);
  pool_ptr<soul::heart::Terminator>::pool_ptr<soul::heart::Terminator,void>(&local_a0,pTVar5);
  *(Terminator **)(__fn + 0x40) = local_a0.object;
  pool_ptr<soul::heart::Terminator>::~pool_ptr(&local_a0);
  return extraout_EAX;
}

Assistant:

void clone (heart::Block& b, const heart::Block& old)
    {
        LinkedList<heart::Statement>::Iterator last;

        for (auto p : old.parameters)
            b.parameters.push_back (cloneVariable (p));

        for (auto s : old.statements)
            last = b.statements.insertAfter (last, cloneStatement (*s));

        SOUL_ASSERT (old.isTerminated());
        b.terminator = cloneTerminator (*old.terminator);
    }